

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O0

void __thiscall
VW::config::options_serializer_boost_po::serialize<unsigned_int>
          (options_serializer_boost_po *this,typed_option<unsigned_int> *typed_option)

{
  uint uVar1;
  ostream *poVar2;
  typed_option<unsigned_int> *in_RSI;
  long in_RDI;
  
  poVar2 = std::operator<<((ostream *)(in_RDI + 0x18)," --");
  poVar2 = std::operator<<(poVar2,(string *)&(in_RSI->super_base_option).m_name);
  poVar2 = std::operator<<(poVar2," ");
  uVar1 = typed_option<unsigned_int>::value(in_RSI);
  std::ostream::operator<<(poVar2,uVar1);
  return;
}

Assistant:

void serialize(typed_option<T>& typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }